

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O2

bool __thiscall
libtorrent::aux::utp_socket_impl::resend_packet(utp_socket_impl *this,packet *p,bool fast_resend)

{
  ushort uVar1;
  undefined2 uVar2;
  int iVar3;
  uint32_t uVar4;
  utp_socket_manager *this_00;
  ulong_long_type uVar5;
  long lVar6;
  utp_socket_impl *this_01;
  bool bVar7;
  error_code eVar8;
  error_code ec;
  __weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2> local_60;
  endpoint local_4c;
  
  if (((this->m_error).failed_ == false) && ((this->field_0x21d & 0x40) == 0)) {
    uVar2 = this->m_acked_seq_nr;
    if (this->m_mtu_seq != 0 && (uint16_t)(uVar2 + 1) == this->m_mtu_seq) {
      this->m_mtu_seq = 0;
      p->field_0xe = p->field_0xe & 0x7f;
      this->m_mtu_ceiling = p->size - 1;
      update_mtu_limits(this);
    }
    iVar3 = this->m_bytes_in_flight;
    if (!fast_resend) {
      uVar4 = *(uint32_t *)((long)&this->m_cwnd + 2);
      if ((int)this->m_adv_wnd < (int)uVar4) {
        uVar4 = this->m_adv_wnd;
      }
      if ((0 < iVar3) && ((int)(uVar4 - iVar3) < (int)((uint)p->size - (uint)p->header_size))) {
        this->field_0x21d = this->field_0x21d | 4;
        goto LAB_0033c275;
      }
    }
    if ((p->field_0xe & 0x40) != 0) {
      this->m_bytes_in_flight = (iVar3 + (uint)p->size) - (uint)p->header_size;
    }
    utp_socket_manager::inc_stats_counter(this->m_sm,0xa8,1);
    if (fast_resend) {
      utp_socket_manager::inc_stats_counter(this->m_sm,0xa7,1);
    }
    p->field_0xe = p->field_0xe & 0xbf;
    big_endian_int<unsigned_int>::operator=
              ((big_endian_int<unsigned_int> *)((long)&p[1].send_time.__d.__r + 7),
               this->m_reply_micro);
    lVar6 = ::std::chrono::_V2::system_clock::now();
    (p->send_time).__d.__r = lVar6;
    this_01 = (utp_socket_impl *)((long)&p[1].send_time.__d.__r + 3);
    big_endian_int<unsigned_int>::operator=
              ((big_endian_int<unsigned_int> *)this_01,(uint)(lVar6 / 1000));
    if (((char)p[1].send_time.__d.__r == '\x01') &&
       (uVar1 = *(ushort *)((long)&p[2].send_time.__d.__r + 1),
       (ushort)(uVar1 << 8 | uVar1 >> 8) != this->m_ack_nr)) {
      if ((this->m_inbuf).m_size == 0) {
        remove_sack_header(this_01,p);
      }
      else {
        write_sack(this,(uint8_t *)((long)&p[2].send_time.__d.__r + 5),
                   (uint)*(byte *)((long)&p[2].send_time.__d.__r + 4));
      }
    }
    big_endian_int<unsigned_short>::operator=
              ((big_endian_int<unsigned_short> *)((long)&p[2].send_time.__d.__r + 1),this->m_ack_nr)
    ;
    ec.val_ = 0;
    ec._4_4_ = ec._4_4_ & 0xffffff00;
    ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
               super_error_category;
    this_00 = this->m_sm;
    ::std::__weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
              (&local_60,
               (__weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2> *)this
              );
    boost::asio::ip::detail::endpoint::endpoint(&local_4c,&this->m_remote_address,this->m_port);
    utp_socket_manager::send_packet
              (this_00,(weak_ptr<libtorrent::aux::utp_socket_interface> *)&local_60,
               (endpoint *)&local_4c,(char *)p->buf,(uint)p->size,&ec,(udp_send_flags_t)0x0);
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_60._M_refcount);
    eVar8 = boost::asio::error::make_error_code(try_again);
    if (ec.val_ == eVar8.val_) {
      uVar5 = (eVar8.cat_)->id_;
      bVar7 = (ec.cat_)->id_ == uVar5;
      if (uVar5 == 0) {
        bVar7 = ec.cat_ == eVar8.cat_;
      }
      if (!bVar7) goto LAB_0033c1ef;
LAB_0033c223:
      this->field_0x21d = this->field_0x21d | 0x40;
      utp_socket_manager::subscribe_writable(this->m_sm,this);
      p->field_0xe = p->field_0xe | 0x40;
      this->m_bytes_in_flight = this->m_bytes_in_flight + ((uint)p->header_size - (uint)p->size);
    }
    else {
LAB_0033c1ef:
      eVar8 = boost::asio::error::make_error_code(try_again);
      if (ec.val_ == eVar8.val_) {
        uVar5 = (eVar8.cat_)->id_;
        bVar7 = (ec.cat_)->id_ == uVar5;
        if (uVar5 == 0) {
          bVar7 = ec.cat_ == eVar8.cat_;
        }
        if (bVar7) goto LAB_0033c223;
      }
      if (ec.failed_ == true) {
        (this->m_error).val_ = ec.val_;
        (this->m_error).failed_ = (bool)ec.failed_;
        *(int3 *)&(this->m_error).field_0x5 = ec._5_3_;
        (this->m_error).cat_ = ec.cat_;
        set_state(this,error_wait);
        test_socket_state(this);
        goto LAB_0033c275;
      }
      utp_socket_manager::inc_stats_counter(this->m_sm,0xa6,1);
      this->m_out_packets = this->m_out_packets + 1;
      p->field_0xe = p->field_0xe & 0xc0 | p->field_0xe + 1 & 0x3f;
    }
    bVar7 = (this->field_0x21d & 0x40) == 0;
  }
  else {
LAB_0033c275:
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool utp_socket_impl::resend_packet(packet* p, bool fast_resend)
{
	INVARIANT_CHECK;

	// for fast re-sends the packet hasn't been marked as needing resending
	TORRENT_ASSERT(p->need_resend || fast_resend);

	if (m_error) return false;
	if (m_stalled) return false;

	if (((m_acked_seq_nr + 1) & ACK_MASK) == m_mtu_seq
		&& m_mtu_seq != 0)
	{
		m_mtu_seq = 0;
		p->mtu_probe = false;
		// we got multiple acks for the packet before our probe, assume
		// it was dropped because it was too big
		m_mtu_ceiling = p->size - 1;
		update_mtu_limits();
	}

	// we can only resend the packet if there's
	// enough space in our congestion window
	// since we can't re-packetize, some packets that are
	// larger than the congestion window must be allowed through
	// but only if we don't have any outstanding bytes
	int const window_size_left = std::min(int(m_cwnd >> 16), int(m_adv_wnd)) - m_bytes_in_flight;
	if (!fast_resend
		&& p->size - p->header_size > window_size_left
		&& m_bytes_in_flight > 0)
	{
		m_cwnd_full = true;
		return false;
	}

	// plus one since we have fast-resend as well, which doesn't
	// necessarily trigger by a timeout
	// the fast-resend path does not check for too many resends, that's only in
	// the time-out path
	TORRENT_ASSERT_VAL(fast_resend || p->num_transmissions < m_sm.num_resends() + 1, m_sm.num_resends());

	TORRENT_ASSERT(p->size - p->header_size >= 0);
	if (p->need_resend) m_bytes_in_flight += p->size - p->header_size;

	m_sm.inc_stats_counter(counters::utp_packet_resend);
	if (fast_resend) m_sm.inc_stats_counter(counters::utp_fast_retransmit);

#if TORRENT_USE_ASSERTS
	if (fast_resend) ++p->num_fast_resend;
#endif
	p->need_resend = false;
	auto* h = reinterpret_cast<utp_header*>(p->buf);
	// update packet header
	h->timestamp_difference_microseconds = m_reply_micro;
	p->send_time = clock_type::now();
	h->timestamp_microseconds = std::uint32_t(
		total_microseconds(p->send_time.time_since_epoch()) & 0xffffffff);

	// if the packet has a selective ack header, we'll need
	// to update it
	if (h->extension == utp_sack && h->ack_nr != m_ack_nr)
	{
		std::uint8_t* ptr = p->buf + sizeof(utp_header);
		int sack_size = ptr[1];
		if (m_inbuf.size())
		{
			// update the sack header
			write_sack(ptr + 2, sack_size);
			TORRENT_ASSERT(ptr + sack_size + 2 <= p->buf + p->header_size);
		}
		else
		{
			remove_sack_header(p);
		}
	}

	h->ack_nr = m_ack_nr;

	error_code ec;
	m_sm.send_packet(m_sock, udp::endpoint(m_remote_address, m_port)
		, reinterpret_cast<char const*>(p->buf), p->size, ec);

#if TORRENT_UTP_LOG
	UTP_LOGV("%8p: re-sending packet seq_nr:%d ack_nr:%d type:%s "
		"id:%d target:%s size:%d error:%s send_buffer_size:%d cwnd:%d "
		"adv_wnd:%d in-flight:%d mtu:%d timestamp:%u time_diff:%d\n"
		, static_cast<void*>(this), int(h->seq_nr), int(h->ack_nr), packet_type_names[h->get_type()]
		, m_send_id, print_endpoint(udp::endpoint(m_remote_address, m_port)).c_str()
		, p->size, ec.message().c_str(), m_write_buffer_size, int(m_cwnd >> 16)
		, m_adv_wnd, m_bytes_in_flight, m_mtu, std::uint32_t(h->timestamp_microseconds)
		, std::uint32_t(h->timestamp_difference_microseconds));
#endif

	if (ec == error::would_block || ec == error::try_again)
	{
#if TORRENT_UTP_LOG
		UTP_LOGV("%8p: socket stalled\n", static_cast<void*>(this));
#endif
		TORRENT_ASSERT(!m_stalled);
		m_stalled = true;
		m_sm.subscribe_writable(this);
		p->need_resend = true;
		m_bytes_in_flight -= p->size - p->header_size;
	}
	else if (ec)
	{
		m_error = ec;
		set_state(state_t::error_wait);
		test_socket_state();
		return false;
	}
	else
	{
		m_sm.inc_stats_counter(counters::utp_packets_out);
		++m_out_packets;
		++p->num_transmissions;
	}

	return !m_stalled;
}